

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) == 0) {
    pbVar5 = (byte *)0x0;
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      lVar7 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar7]] & 8) != 0);
    s = s + lVar8;
    pbVar5 = (byte *)s;
  }
  do {
    lVar7 = lVar8;
    pbVar4 = pbVar5;
    bVar3 = *s;
    bVar6 = (anonymous_namespace)::chartype_table[bVar3];
    if ((bVar6 & 0xc) == 0) {
      pbVar5 = (byte *)s + 2;
      do {
        s = (char_t *)pbVar5;
        bVar3 = ((byte *)s)[-1];
        bVar6 = (anonymous_namespace)::chartype_table[bVar3];
        if ((bVar6 & 0xc) != 0) {
          s = (char_t *)((byte *)s + -1);
          goto LAB_0032e708;
        }
        bVar3 = *s;
        bVar6 = (anonymous_namespace)::chartype_table[bVar3];
        if ((bVar6 & 0xc) != 0) goto LAB_0032e708;
        bVar3 = ((byte *)s)[1];
        bVar6 = (anonymous_namespace)::chartype_table[bVar3];
        if ((bVar6 & 0xc) != 0) {
          s = (char_t *)((byte *)s + 1);
          goto LAB_0032e708;
        }
        bVar3 = ((byte *)s)[2];
        bVar6 = (anonymous_namespace)::chartype_table[bVar3];
        pbVar5 = (byte *)s + 4;
      } while ((bVar6 & 0xc) == 0);
      s = (char_t *)((byte *)s + 2);
    }
LAB_0032e708:
    if (bVar3 == end_quote) {
      pbVar5 = (byte *)s;
      if (pbVar4 != (byte *)0x0) {
        memmove(pbVar4 + -lVar7,pbVar4,(long)s - (long)pbVar4);
        pbVar5 = (byte *)s + -lVar7;
      }
      do {
        *pbVar5 = 0;
        pbVar4 = pbVar5 + -1;
        pbVar5 = pbVar5 + -1;
      } while (((anonymous_namespace)::chartype_table[*pbVar4] & 8) != 0);
      return (char_t *)((byte *)s + 1);
    }
    lVar8 = lVar7;
    pbVar5 = pbVar4;
    if ((bVar6 & 8) == 0) {
      if (bVar3 == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)((byte *)s + 1);
    }
    else {
      pbVar1 = (byte *)s + 1;
      *s = 0x20;
      pbVar2 = (byte *)s + 1;
      s = (char_t *)pbVar1;
      if (((anonymous_namespace)::chartype_table[*pbVar2] & 8) != 0) {
        do {
          pbVar5 = (byte *)s + 1;
          s = (char_t *)((byte *)s + 1);
          lVar8 = lVar8 + 1;
        } while (((anonymous_namespace)::chartype_table[*pbVar5] & 8) != 0);
        pbVar5 = (byte *)s;
        if (pbVar4 != (byte *)0x0) {
          memmove(pbVar4 + -lVar7,pbVar4,(long)pbVar1 - (long)pbVar4);
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}